

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FinalParser.cpp
# Opt level: O2

void __thiscall FinalParser::ProcessDecl(FinalParser *this)

{
  pointer pqVar1;
  bool bVar2;
  ulong uVar3;
  long lVar4;
  string local_130;
  string local_110;
  string local_f0;
  Sym local_d0;
  Sym newsym;
  
  lVar4 = 0xf8;
  uVar3 = 0;
  while( true ) {
    pqVar1 = (this->token).super__Vector_base<quadraple,_std::allocator<quadraple>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)(((long)(this->token).super__Vector_base<quadraple,_std::allocator<quadraple>_>.
                       _M_impl.super__Vector_impl_data._M_finish - (long)pqVar1) / 0x48) <= uVar3) {
      return;
    }
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&pqVar1[-3].tokentype._M_dataplus + lVar4),"{");
    if (bVar2) break;
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&(this->token).
                                    super__Vector_base<quadraple,_std::allocator<quadraple>_>.
                                    _M_impl.super__Vector_impl_data._M_start[-3].tokentype.
                                    _M_dataplus + lVar4),"real");
    if ((bVar2) ||
       (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((long)&(this->token).
                                         super__Vector_base<quadraple,_std::allocator<quadraple>_>.
                                         _M_impl.super__Vector_impl_data._M_start[-3].tokentype.
                                         _M_dataplus + lVar4),"int"), bVar2)) {
      std::__cxx11::string::string
                ((string *)&local_130,
                 (string *)
                 ((long)&(this->token).super__Vector_base<quadraple,_std::allocator<quadraple>_>.
                         _M_impl.super__Vector_impl_data._M_start[-3].tokentype._M_dataplus + lVar4)
                );
      std::__cxx11::string::string
                ((string *)&local_f0,
                 (string *)
                 ((long)&(this->token).super__Vector_base<quadraple,_std::allocator<quadraple>_>.
                         _M_impl.super__Vector_impl_data._M_start[-2].tokentype._M_dataplus + lVar4)
                );
      std::__cxx11::string::string
                ((string *)&local_110,
                 (string *)
                 ((long)&(((this->token).super__Vector_base<quadraple,_std::allocator<quadraple>_>.
                           _M_impl.super__Vector_impl_data._M_start)->tokentype)._M_dataplus + lVar4
                 ));
      Sym::Sym(&newsym,&local_130,&local_f0,&local_110);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_130);
      Sym::Sym(&local_d0,&newsym);
      SymTable::AddSym(&this->table,&local_d0);
      Sym::~Sym(&local_d0);
      Sym::~Sym(&newsym);
    }
    uVar3 = uVar3 + 1;
    lVar4 = lVar4 + 0x48;
  }
  this->index = (int)uVar3;
  return;
}

Assistant:

void FinalParser::ProcessDecl() {

    for (int i = 0; i < token.size(); i++) {
        if (token[i].attributevalue == "{") {
            index = i;
            return;
        } else if (token[i].attributevalue == "real" || token[i].attributevalue == "int") {
            Sym newsym(token[i].attributevalue, token[i + 1].attributevalue, token[i + 3].attributevalue);
            table.AddSym(newsym);
        }
    }
}